

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O0

string * __thiscall
jaegertracing::propagation::HTTPHeaderPropagator::normalizeKey
          (string *__return_storage_ptr__,HTTPHeaderPropagator *this,string *rawKey)

{
  const_iterator cVar1;
  const_iterator cVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar3;
  string *rawKey_local;
  HTTPHeaderPropagator *this_local;
  string *key;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cVar1 = std::begin<std::__cxx11::string>(rawKey);
  cVar2 = std::end<std::__cxx11::string>(rawKey);
  bVar3 = std::back_inserter<std::__cxx11::string>(__return_storage_ptr__);
  std::
  transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>,jaegertracing::propagation::HTTPHeaderPropagator::normalizeKey(std::__cxx11::string_const&)const::_lambda(char)_1_>
            (cVar1._M_current,cVar2._M_current,bVar3.container);
  return __return_storage_ptr__;
}

Assistant:

std::string normalizeKey(const std::string& rawKey) const override
    {
        std::string key;
        key.reserve(rawKey.size());
        std::transform(std::begin(rawKey),
                       std::end(rawKey),
                       std::back_inserter(key),
                       [](char ch) { return std::tolower(ch); });
        return key;
    }